

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

transaction_base * __thiscall pstore::transaction_base::commit(transaction_base *this)

{
  bool bVar1;
  __int_type _Var2;
  uint32_t uVar3;
  typed_address<pstore::trailer> addr;
  typed_address<pstore::trailer> new_footer_pos_00;
  element_type *peVar4;
  element_type *this_00;
  uint64_t __i;
  address aVar5;
  typed_address<pstore::trailer> local_100;
  value_type local_f8;
  address local_f0;
  address local_e8;
  address local_e0;
  element_type *local_d8;
  trailer *t;
  pair<std::shared_ptr<pstore::trailer>,_pstore::typed_address<pstore::trailer>_> local_c0;
  undefined1 local_a8 [8];
  shared_ptr<pstore::trailer> trailer_ptr;
  undefined1 auStack_88 [8];
  index_records_array locations;
  uint generation;
  undefined1 local_40 [8];
  shared_ptr<const_pstore::trailer> prev_footer;
  header *head;
  typed_address<pstore::trailer> new_footer_pos;
  database *db;
  transaction_base *this_local;
  
  bVar1 = is_open(this);
  if (bVar1) {
    addr.a_.a_ = (address)transaction_base::db(this);
    new_footer_pos_00 = typed_address<pstore::trailer>::null();
    prev_footer.super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            database::get_header((database *)addr.a_.a_);
    std::atomic<pstore::typed_address<pstore::trailer>_>::load
              (&((header *)
                prev_footer.super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->footer_pos,memory_order_seq_cst);
    database::getro<pstore::trailer,void>((database *)local_40,addr);
    peVar4 = std::
             __shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_int
                      ((__atomic_base *)&(peVar4->a).generation);
    peVar4 = std::
             __shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
    auStack_88 = (undefined1  [8])(peVar4->a).index_records._M_elems[0].a_.a_;
    locations._M_elems[0].a_.a_ = (address)(peVar4->a).index_records._M_elems[1].a_.a_;
    locations._M_elems[1].a_.a_ = (address)(peVar4->a).index_records._M_elems[2].a_.a_;
    locations._M_elems[2].a_.a_ = (address)(peVar4->a).index_records._M_elems[3].a_.a_;
    locations._M_elems[3].a_.a_ = (address)(peVar4->a).index_records._M_elems[4].a_.a_;
    locations._M_elems[4].a_.a_ = (address)(peVar4->a).index_records._M_elems[5].a_.a_;
    pstore::index::flush_indices(this,(index_records_array *)auStack_88,_Var2 + 1);
    std::shared_ptr<pstore::trailer>::shared_ptr((shared_ptr<pstore::trailer> *)local_a8);
    alloc_rw<pstore::trailer,void>(&local_c0,this,1);
    std::tie<std::shared_ptr<pstore::trailer>,pstore::typed_address<pstore::trailer>>
              ((shared_ptr<pstore::trailer> *)&t,(typed_address<pstore::trailer> *)local_a8);
    std::tuple<std::shared_ptr<pstore::trailer>&,pstore::typed_address<pstore::trailer>&>::operator=
              ((tuple<std::shared_ptr<pstore::trailer>&,pstore::typed_address<pstore::trailer>&> *)
               &t,&local_c0);
    std::pair<std::shared_ptr<pstore::trailer>,_pstore::typed_address<pstore::trailer>_>::~pair
              (&local_c0);
    this_00 = std::__shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<pstore::trailer,_(__gnu_cxx::_Lock_policy)2> *)local_a8);
    trailer::trailer(this_00);
    (this_00->a).index_records._M_elems[4].a_.a_ = (value_type)locations._M_elems[3].a_.a_;
    (this_00->a).index_records._M_elems[5].a_.a_ = (value_type)locations._M_elems[4].a_.a_;
    (this_00->a).index_records._M_elems[2].a_.a_ = (value_type)locations._M_elems[1].a_.a_;
    (this_00->a).index_records._M_elems[3].a_.a_ = (value_type)locations._M_elems[2].a_.a_;
    (this_00->a).index_records._M_elems[0].a_.a_ = (value_type)auStack_88;
    (this_00->a).index_records._M_elems[1].a_.a_ = (value_type)locations._M_elems[0].a_.a_;
    local_d8 = this_00;
    std::__atomic_base<unsigned_int>::operator=
              (&(this_00->a).generation.super___atomic_base<unsigned_int>,_Var2 + 1);
    std::__atomic_base<unsigned_long>::operator=
              (&(local_d8->a).size.super___atomic_base<unsigned_long>,this->size_ - 0x70);
    __i = milliseconds_since_epoch();
    std::__atomic_base<unsigned_long>::operator=
              (&(local_d8->a).time.super___atomic_base<unsigned_long>,__i);
    local_e0.a_ = (value_type)
                  std::atomic::operator_cast_to_typed_address
                            ((atomic *)
                             &prev_footer.
                              super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._M_use_count);
    (local_d8->a).prev_generation.a_.a_ = local_e0.a_;
    uVar3 = trailer::get_crc(local_d8);
    local_d8->crc = uVar3;
    std::shared_ptr<pstore::trailer>::~shared_ptr((shared_ptr<pstore::trailer> *)local_a8);
    std::shared_ptr<const_pstore::trailer>::~shared_ptr
              ((shared_ptr<const_pstore::trailer> *)local_40);
    local_e8 = new_footer_pos_00.a_.a_;
    database::set_new_footer((database *)addr.a_.a_,new_footer_pos_00);
    local_f0.a_ = (this->first_).a_;
    local_100 = operator+(new_footer_pos_00,1);
    local_f8 = (value_type)typed_address<pstore::trailer>::to_address(&local_100);
    database::protect((database *)addr.a_.a_,local_f0,(address)local_f8);
    aVar5 = address::null();
    (this->first_).a_ = aVar5.a_;
    bVar1 = is_open(this);
    if (bVar1) {
      assert_failed("!this->is_open ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/transaction.cpp"
                    ,0x8d);
    }
  }
  return this;
}

Assistant:

transaction_base & transaction_base::commit () {
        if (!this->is_open ()) {
            // No data was added to the transaction. Nothing to do.
            return *this;
        }

        database & db = this->db ();

        // We're going to write to the header, but this must be the very last
        // step of completing the transaction.
        auto new_footer_pos = typed_address<trailer>::null ();
        {
            auto const & head = db.get_header ();
            auto const prev_footer = db.getro (head.footer_pos.load ());

            unsigned const generation = prev_footer->a.generation + 1;

            // Make a copy of the index locations; write out any modifications to the indices.
            // Any updated indices will modify the 'locations' array.
            //
            // This must happen before the transaction is final because we're allocating and
            // writing data here.

            auto locations = prev_footer->a.index_records;
            index::flush_indices (*this, &locations, generation);

            // Writing new data is done. Now we begin to build the new file footer.
            {
                std::shared_ptr<trailer> trailer_ptr;
                std::tie (trailer_ptr, new_footer_pos) = this->alloc_rw<trailer> ();
                auto * const t = new (trailer_ptr.get ()) trailer;

                t->a.index_records = locations;

                // Point the new header at the previous version.
                t->a.generation = generation;
                // The size of the transaction doesn't include the size of the footer record.
                t->a.size = size_ - sizeof (trailer);
                t->a.time = pstore::milliseconds_since_epoch ();
                t->a.prev_generation = head.footer_pos;
                t->crc = t->get_crc ();
            }
        }
        // Complete the transaction by making it available to other clients. This modifies the
        // footer pointer in the file's header record.
        db.set_new_footer (new_footer_pos);

        // Mark both this transaction's contents and its trailer as read-only.
        db.protect (first_, (new_footer_pos + 1).to_address ());

        // That's the end of this transaction.
        first_ = address::null ();
        PSTORE_ASSERT (!this->is_open ()); //! OCLINT(PH - don't warn about the assert macro)
        return *this;
    }